

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_switch_Dyy_unconditional_opt
               (response_layer *layer,integral_image *iimage)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  float *pfVar24;
  int iVar25;
  float *pfVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  bool *pbVar38;
  float *pfVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  float *data;
  uint uVar45;
  float *pfVar46;
  int iVar47;
  float *pfVar48;
  float fVar49;
  float afStack_188 [12];
  float *local_158;
  bool *local_150;
  integral_image *local_130;
  float *data_7;
  float *local_b8;
  float *local_b0;
  float *local_a0;
  float *local_90;
  float *local_88;
  float *local_78;
  float *local_70;
  long local_68;
  float *local_60;
  int local_34;
  
  iVar15 = iimage->height;
  iVar9 = layer->filter_size;
  if (iVar9 <= iVar15) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar2 = iimage->width;
  uVar41 = (iVar9 + -1) - (iVar9 + -1 >> 0x1f) >> 1;
  uVar40 = iVar9 / 3;
  if (iVar15 <= (int)uVar41) {
    iVar25 = layer->height;
    iVar14 = iimage->data_width;
    local_68 = (long)iVar14;
    pfVar24 = iimage->data;
    iVar32 = layer->step;
    pfVar46 = (float *)(long)iVar32;
    fVar49 = 1.0 / (float)(iVar9 * iVar9);
    local_158 = layer->response;
    local_150 = layer->laplacian;
    if ((int)uVar40 < (int)uVar2) {
      lVar17 = -0x188 - ((ulong)uVar2 * 4 + 0xf & 0xfffffffffffffff0);
      local_34 = layer->width * iVar32;
      uVar27 = local_34 - uVar40;
      local_130 = iimage;
      data_7 = pfVar46;
      if (uVar27 == 0 || local_34 < (int)uVar40) {
        lVar29 = 0;
      }
      else {
        lVar29 = 0;
        do {
          *(float *)((long)afStack_188 + lVar29 * 4 + lVar17 + 0x188) =
               pfVar24[(int)((uVar40 - 1) + (iVar15 + -1) * iVar14 + (int)lVar29)];
          lVar29 = lVar29 + (long)pfVar46;
        } while (lVar29 < (long)(ulong)uVar27);
        iVar14 = (int)local_68;
      }
      iVar14 = (iVar15 + -1) * iVar14;
      fVar1 = pfVar24[(int)((uVar2 - 1) + iVar14)];
      if ((int)lVar29 < (int)uVar40) {
        lVar29 = (long)(int)lVar29;
        do {
          *(float *)((long)afStack_188 + lVar29 * 4 + lVar17 + 0x188) = fVar1;
          lVar29 = lVar29 + (long)pfVar46;
        } while (lVar29 < (int)uVar40);
      }
      lVar33 = (long)local_34;
      iVar15 = (int)lVar29;
      if (iVar15 < local_34) {
        lVar29 = (long)iVar15;
        iVar15 = (iVar14 + iVar15) - uVar40;
        do {
          *(float *)((long)afStack_188 + lVar29 * 4 + lVar17 + 0x188) = fVar1 - pfVar24[iVar15];
          lVar29 = lVar29 + (long)pfVar46;
          iVar15 = iVar15 + iVar32;
        } while (lVar29 < lVar33);
      }
      iVar25 = iVar25 * iVar32;
      if (0 < iVar25) {
        uVar2 = iVar9 / 6;
        lVar29 = (long)(int)uVar40;
        uVar27 = ~uVar40;
        uVar45 = ~uVar2;
        iVar15 = uVar40 - 1;
        iVar47 = iVar15 - uVar2;
        uVar11 = ~(long)(int)uVar2;
        iVar9 = -uVar40;
        uVar30 = lVar29 * 4 ^ 0xfffffffffffffffc;
        iVar32 = 0;
        iVar43 = -1;
        iVar14 = 0;
        do {
          iVar28 = (int)data_7;
          if (0 < local_34) {
            pfVar46 = local_130->data;
            iVar3 = local_130->data_width;
            lVar18 = (long)(int)(iVar3 * uVar40);
            lVar23 = (long)(iVar3 * iVar32);
            lVar34 = (long)(iVar3 * iVar43);
            lVar37 = (long)(int)(iVar3 * uVar27);
            lVar19 = (long)(iVar3 * iVar15);
            lVar44 = (long)(iVar3 * iVar9);
            pfVar24 = local_158 + iVar14;
            pbVar38 = local_150 + iVar14;
            iVar16 = iVar3 * iVar15 + ~uVar41;
            iVar42 = iVar3 * iVar9 + ~uVar41;
            lVar35 = 0;
            do {
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)((pfVar46[((int)(iVar3 * uVar45) + lVar35) -
                                                               lVar29] -
                                                      pfVar46[(iVar3 * iVar47 + lVar35) - lVar29]) +
                                                     (pfVar46[lVar29 + (long)(iVar3 * iVar47) +
                                                                       lVar35 + -2] -
                                                     pfVar46[lVar29 + (long)(int)(iVar3 * uVar45) +
                                                                      lVar35 + -2]))),
                                       SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416(*(uint *)((long)afStack_188 +
                                                        lVar35 * 4 + lVar17 + 0x188)));
              auVar8 = vfmadd213ss_fma(ZEXT416((uint)((pfVar46[uVar11 + lVar44 + lVar35] -
                                                      pfVar46[uVar11 + lVar19 + lVar35]) +
                                                     (pfVar46[uVar11 + lVar29 + lVar19 + lVar35] -
                                                     pfVar46[uVar11 + lVar29 + lVar44 + lVar35]))),
                                       SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416((uint)((pfVar46[iVar42] - pfVar46[iVar16]) +
                                                     (pfVar46[(long)(int)uVar41 + lVar19 + lVar35] -
                                                     pfVar46[(long)(int)uVar41 + lVar44 + lVar35])))
                                      );
              fVar1 = fVar49 * auVar7._0_4_;
              fVar5 = fVar49 * auVar8._0_4_;
              fVar6 = fVar49 * ((((pfVar46[lVar37 + lVar35] - pfVar46[lVar34 + lVar35]) +
                                  (pfVar46[lVar29 + lVar34 + lVar35] -
                                  pfVar46[lVar29 + lVar37 + lVar35]) +
                                 (pfVar46[lVar18 + lVar35 + -1] - pfVar46[lVar23 + lVar35 + -1]) +
                                 (*(float *)((long)pfVar46 + lVar35 * 4 + lVar23 * 4 + uVar30) -
                                 *(float *)((long)pfVar46 + lVar35 * 4 + lVar18 * 4 + uVar30))) -
                                ((pfVar46[lVar34 + lVar35 + -1] - pfVar46[lVar37 + lVar35 + -1]) +
                                (*(float *)((long)pfVar46 + lVar35 * 4 + lVar37 * 4 + uVar30) -
                                *(float *)((long)pfVar46 + lVar35 * 4 + lVar34 * 4 + uVar30)))) -
                               ((pfVar46[lVar29 + lVar18 + lVar35] -
                                pfVar46[lVar29 + lVar23 + lVar35]) +
                               (pfVar46[lVar23 + lVar35] - pfVar46[lVar18 + lVar35])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6 * -0.81)),ZEXT416((uint)fVar5),
                                       ZEXT416((uint)fVar1));
              *pfVar24 = auVar7._0_4_;
              *pbVar38 = 0.0 <= fVar1 + fVar5;
              lVar35 = lVar35 + (long)data_7;
              pfVar24 = pfVar24 + 1;
              pbVar38 = pbVar38 + 1;
              iVar14 = iVar14 + 1;
              iVar16 = iVar16 + iVar28;
              iVar42 = iVar42 + iVar28;
            } while (lVar35 < lVar33);
          }
          iVar32 = iVar32 + iVar28;
          uVar40 = uVar40 + iVar28;
          iVar43 = iVar43 + iVar28;
          uVar27 = uVar27 + iVar28;
          iVar15 = iVar15 + iVar28;
          iVar9 = iVar9 + iVar28;
          iVar47 = iVar47 + iVar28;
          uVar45 = uVar45 + iVar28;
        } while (iVar32 < iVar25);
      }
    }
    else {
      fVar1 = pfVar24[(int)((iVar15 + -1) * iVar14 + -1 + uVar2)];
      iVar15 = layer->width * iVar32;
      uVar27 = iVar9 / 6;
      lVar17 = (long)iVar15;
      uVar11 = (ulong)(int)uVar40;
      lVar29 = (long)(int)uVar27;
      if (iVar15 - uVar27 == 0 || iVar15 < (int)uVar27) {
        iVar9 = 0;
        lVar33 = 0;
      }
      else {
        lVar33 = local_68 * uVar11;
        local_a0 = pfVar24 + -local_68;
        lVar19 = (uVar11 - 1) * local_68;
        pfVar22 = pfVar24 + lVar33;
        lVar23 = (long)pfVar46 * local_68;
        pfVar39 = pfVar24 + ~uVar11 * local_68;
        local_60 = pfVar24 + ((lVar19 + -1) - lVar29);
        lVar18 = (lVar29 * 4 + lVar33 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar24;
        pfVar10 = pfVar24 + lVar19 + (int)uVar41;
        pfVar26 = pfVar24 + ((int)uVar41 - lVar33);
        local_b8 = (float *)((local_68 * 4 + 4) * uVar11 + (long)pfVar24);
        pfVar13 = pfVar24 + (uVar11 - local_68);
        local_b0 = pfVar24 + ((lVar19 + (uVar11 - 1)) - lVar29);
        pfVar21 = pfVar24 + ~uVar11 * local_68 + uVar11;
        local_78 = (float *)((local_68 * -4 + 4) * uVar11 + lVar29 * -4 + -4 + (long)pfVar24);
        local_90 = pfVar24 + uVar11;
        lVar33 = 0;
        iVar9 = 0;
        pfVar12 = pfVar24;
        do {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar24[(int)((uVar40 + ~uVar27 + (int)lVar33) *
                                                               iVar14 + (uVar2 - 1))]),
                                   SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar15) {
            fVar5 = fVar49 * auVar7._0_4_;
            pfVar20 = local_158 + iVar9;
            pbVar38 = local_150 + iVar9;
            lVar19 = 0;
            uVar45 = ~uVar41;
            uVar36 = ~uVar40;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((local_b0[lVar19] -
                                                      *(float *)((long)local_78 + lVar19 * 4)) +
                                                     (*(float *)(lVar18 + lVar19 * 4) -
                                                     local_60[lVar19]))),
                                       ZEXT416((uint)((pfVar24[(lVar33 - uVar11) * local_68 +
                                                               (long)(int)uVar45] -
                                                      pfVar24[(lVar33 + -1 + uVar11) * local_68 +
                                                              (long)(int)uVar45]) +
                                                     (pfVar10[lVar19] - pfVar26[lVar19]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = fVar49 * auVar7._0_4_;
              fVar4 = fVar49 * ((((pfVar24[lVar33 * local_68 + (long)(int)uVar36] -
                                  pfVar24[(lVar33 + uVar11) * local_68 + (long)(int)uVar36]) +
                                  (pfVar22[lVar19 + -1] - pfVar12[lVar19 + -1]) +
                                 (pfVar13[lVar19] - pfVar21[lVar19]) +
                                 (pfVar39[lVar19] - local_a0[lVar19])) -
                                ((pfVar24[((lVar33 + -1) - uVar11) * local_68 + (long)(int)uVar36] -
                                 pfVar24[(lVar33 + -1) * local_68 + (long)(int)uVar36]) +
                                (local_a0[lVar19 + -1] - pfVar39[lVar19 + -1]))) -
                               ((pfVar12[lVar19] - pfVar22[lVar19]) +
                               (local_b8[lVar19] - local_90[lVar19])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar20 = auVar7._0_4_;
              *pbVar38 = 0.0 <= fVar5 + fVar6;
              lVar19 = lVar19 + (long)pfVar46;
              pfVar20 = pfVar20 + 1;
              pbVar38 = pbVar38 + 1;
              iVar9 = iVar9 + 1;
              uVar36 = uVar36 + iVar32;
              uVar45 = uVar45 + iVar32;
            } while (lVar19 < lVar17);
          }
          lVar33 = lVar33 + (long)pfVar46;
          pfVar22 = pfVar22 + lVar23;
          pfVar12 = pfVar12 + lVar23;
          local_a0 = local_a0 + lVar23;
          pfVar39 = pfVar39 + lVar23;
          local_60 = local_60 + lVar23;
          lVar18 = lVar18 + lVar23 * 4;
          pfVar10 = pfVar10 + lVar23;
          pfVar26 = pfVar26 + lVar23;
          local_b8 = local_b8 + lVar23;
          local_90 = local_90 + lVar23;
          pfVar13 = pfVar13 + lVar23;
          pfVar21 = pfVar21 + lVar23;
          local_b0 = local_b0 + lVar23;
          local_78 = (float *)((long)local_78 + lVar23 * 4);
        } while (lVar33 < (long)(ulong)(iVar15 - uVar27));
      }
      fVar1 = fVar1 * -2.0;
      if ((int)lVar33 <= (int)uVar27) {
        fVar5 = fVar49 * fVar1;
        lVar33 = (long)(int)lVar33;
        lVar19 = (lVar33 + uVar11) * local_68;
        lVar37 = (long)pfVar46 * local_68;
        lVar23 = (lVar33 + -1 + uVar11) * local_68;
        lVar34 = (lVar33 - uVar11) * local_68;
        lVar18 = (lVar33 + -1) * local_68;
        lVar35 = ((lVar33 + -1) - uVar11) * local_68;
        local_a0 = pfVar24 + lVar19;
        pfVar22 = pfVar24 + lVar33 * local_68;
        local_88 = pfVar24 + lVar18;
        pfVar39 = pfVar24 + lVar35;
        local_60 = pfVar24 + ((lVar23 + -1) - lVar29);
        pfVar12 = pfVar24 + ((lVar34 + -1) - lVar29);
        pfVar13 = pfVar24 + lVar23 + (int)uVar41;
        pfVar10 = pfVar24 + lVar34 + (int)uVar41;
        pfVar21 = pfVar24 + lVar19 + uVar11;
        pfVar26 = pfVar24 + lVar33 * local_68 + uVar11;
        local_b8 = pfVar24 + lVar18 + uVar11;
        local_78 = pfVar24 + ((lVar23 + (uVar11 - 1)) - lVar29);
        local_b0 = pfVar24 + lVar35 + uVar11;
        local_90 = pfVar24 + ((lVar34 + (uVar11 - 1)) - lVar29);
        do {
          if (0 < iVar15) {
            pfVar20 = local_158 + iVar9;
            pbVar38 = local_150 + iVar9;
            lVar18 = 0;
            uVar45 = ~uVar41;
            uVar36 = ~uVar40;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((local_78[lVar18] - local_90[lVar18]) +
                                                     (pfVar12[lVar18] - local_60[lVar18]))),
                                       ZEXT416((uint)((pfVar24[(lVar33 - uVar11) * local_68 +
                                                               (long)(int)uVar45] -
                                                      pfVar24[(lVar33 + -1 + uVar11) * local_68 +
                                                              (long)(int)uVar45]) +
                                                     (pfVar13[lVar18] - pfVar10[lVar18]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = fVar49 * auVar7._0_4_;
              fVar4 = fVar49 * ((((pfVar24[lVar33 * local_68 + (long)(int)uVar36] -
                                  pfVar24[(lVar33 + uVar11) * local_68 + (long)(int)uVar36]) +
                                  (local_a0[lVar18 + -1] - pfVar22[lVar18 + -1]) +
                                 (local_b8[lVar18] - local_b0[lVar18]) +
                                 (pfVar39[lVar18] - local_88[lVar18])) -
                                ((pfVar24[((lVar33 + -1) - uVar11) * local_68 + (long)(int)uVar36] -
                                 pfVar24[(lVar33 + -1) * local_68 + (long)(int)uVar36]) +
                                (local_88[lVar18 + -1] - pfVar39[lVar18 + -1]))) -
                               ((pfVar22[lVar18] - local_a0[lVar18]) +
                               (pfVar21[lVar18] - pfVar26[lVar18])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar20 = auVar7._0_4_;
              *pbVar38 = 0.0 <= fVar5 + fVar6;
              lVar18 = lVar18 + (long)pfVar46;
              pfVar20 = pfVar20 + 1;
              pbVar38 = pbVar38 + 1;
              iVar9 = iVar9 + 1;
              uVar36 = uVar36 + iVar32;
              uVar45 = uVar45 + iVar32;
            } while (lVar18 < lVar17);
          }
          lVar33 = lVar33 + (long)pfVar46;
          local_a0 = local_a0 + lVar37;
          pfVar22 = pfVar22 + lVar37;
          local_88 = local_88 + lVar37;
          pfVar39 = pfVar39 + lVar37;
          local_60 = local_60 + lVar37;
          pfVar12 = pfVar12 + lVar37;
          pfVar13 = pfVar13 + lVar37;
          pfVar10 = pfVar10 + lVar37;
          pfVar21 = pfVar21 + lVar37;
          pfVar26 = pfVar26 + lVar37;
          local_b8 = local_b8 + lVar37;
          local_b0 = local_b0 + lVar37;
          local_78 = local_78 + lVar37;
          local_90 = local_90 + lVar37;
        } while (lVar33 <= lVar29);
      }
      iVar25 = iVar25 * iVar32;
      if ((int)lVar33 < iVar25) {
        lVar33 = (long)(int)lVar33;
        lVar23 = (lVar33 + uVar11) * local_68;
        lVar34 = (long)pfVar46 * local_68;
        lVar18 = (lVar33 + -1 + uVar11) * local_68;
        lVar35 = (lVar33 - uVar11) * local_68;
        lVar37 = (lVar33 + -1) * local_68;
        lVar19 = ((lVar33 + -1) - uVar11) * local_68;
        pfVar22 = pfVar24 + lVar23;
        pfVar39 = pfVar24 + lVar33 * local_68;
        pfVar12 = pfVar24 + lVar37;
        pfVar10 = pfVar24 + lVar19;
        local_70 = pfVar24 + ((lVar18 + -1) - lVar29);
        local_60 = pfVar24 + ((lVar35 + -1) - lVar29);
        pfVar13 = pfVar24 + lVar18 + (int)uVar41;
        pfVar21 = pfVar24 + lVar35 + (int)uVar41;
        pfVar48 = pfVar24 + lVar23 + uVar11;
        pfVar20 = pfVar24 + lVar33 * local_68 + uVar11;
        pfVar26 = pfVar24 + lVar37 + uVar11;
        local_b8 = pfVar24 + lVar19 + uVar11;
        local_b0 = pfVar24 + ((lVar18 + (uVar11 - 1)) - lVar29);
        local_78 = pfVar24 + ((lVar35 + (uVar11 - 1)) - lVar29);
        do {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar24[(int)((~uVar27 + (int)lVar33) * iVar14 +
                                                              (uVar2 - 1))]),
                                   SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar15) {
            fVar5 = fVar49 * auVar7._0_4_;
            pfVar31 = local_158 + iVar9;
            pbVar38 = local_150 + iVar9;
            lVar29 = 0;
            uVar45 = ~uVar41;
            uVar36 = ~uVar40;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((local_60[lVar29] - local_70[lVar29]) +
                                                     (local_b0[lVar29] - local_78[lVar29]))),
                                       ZEXT416((uint)((pfVar13[lVar29] - pfVar21[lVar29]) +
                                                     (pfVar24[(lVar33 - uVar11) * local_68 +
                                                              (long)(int)uVar45] -
                                                     pfVar24[(lVar33 + -1 + uVar11) * local_68 +
                                                             (long)(int)uVar45]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = auVar7._0_4_ * fVar49;
              fVar4 = fVar49 * ((((pfVar24[lVar33 * local_68 + (long)(int)uVar36] -
                                  pfVar24[(lVar33 + uVar11) * local_68 + (long)(int)uVar36]) +
                                  (pfVar22[lVar29 + -1] - pfVar39[lVar29 + -1]) +
                                 (pfVar26[lVar29] - local_b8[lVar29]) +
                                 (pfVar10[lVar29] - pfVar12[lVar29])) -
                                ((pfVar24[((lVar33 + -1) - uVar11) * local_68 + (long)(int)uVar36] -
                                 pfVar24[(lVar33 + -1) * local_68 + (long)(int)uVar36]) +
                                (pfVar12[lVar29 + -1] - pfVar10[lVar29 + -1]))) -
                               ((pfVar39[lVar29] - pfVar22[lVar29]) +
                               (pfVar48[lVar29] - pfVar20[lVar29])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar31 = auVar7._0_4_;
              *pbVar38 = 0.0 <= fVar6 + fVar5;
              lVar29 = lVar29 + (long)pfVar46;
              pfVar31 = pfVar31 + 1;
              pbVar38 = pbVar38 + 1;
              iVar9 = iVar9 + 1;
              uVar36 = uVar36 + iVar32;
              uVar45 = uVar45 + iVar32;
            } while (lVar29 < lVar17);
          }
          lVar33 = lVar33 + (long)pfVar46;
          pfVar22 = pfVar22 + lVar34;
          pfVar39 = pfVar39 + lVar34;
          pfVar12 = pfVar12 + lVar34;
          pfVar10 = pfVar10 + lVar34;
          local_70 = local_70 + lVar34;
          local_60 = local_60 + lVar34;
          pfVar13 = pfVar13 + lVar34;
          pfVar21 = pfVar21 + lVar34;
          pfVar48 = pfVar48 + lVar34;
          pfVar20 = pfVar20 + lVar34;
          pfVar26 = pfVar26 + lVar34;
          local_b8 = local_b8 + lVar34;
          local_b0 = local_b0 + lVar34;
          local_78 = local_78 + lVar34;
        } while (lVar33 < iVar25);
      }
    }
    return;
  }
  if (SBORROW4(uVar2,uVar40 * 2) == (int)(uVar2 + uVar40 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional

        optimization:
        - box_integral_unconditional_opt instead of box_integral_unconditional
        - scalar replacement for more optimal flops count
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width*step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;
                    t9 = x - lobe / 2 - 1;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}